

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 float128_to_float64_mips64(float128 a,float_status *status)

{
  uint64_t zSig;
  float64 fVar1;
  ulong uVar2;
  uint uVar3;
  int zExp;
  commonNaNT local_20;
  
  uVar3 = a.high._6_2_ & 0x7fff;
  if (uVar3 != 0x7fff) {
    uVar2 = (ulong)(((undefined1  [16])a & (undefined1  [16])0x3ffffffffffff) !=
                   (undefined1  [16])0x0) | (a.high & 0xffffffffffff) << 0xe | a.low >> 0x32;
    zExp = uVar3 - 0x3c01;
    zSig = uVar2 | 0x4000000000000000;
    if (uVar2 == 0 &&
        ((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      zExp = 0;
      zSig = 0;
    }
    fVar1 = roundAndPackFloat64(a.high._7_1_ >> 7,zExp,zSig,status);
    return fVar1;
  }
  if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
      a.low == 0) {
    uVar2 = a.high & 0x8000000000000000;
  }
  else {
    float128ToCommonNaN(&local_20,a,status);
    if ((status->default_nan_mode != '\0') || (local_20.high < 0x1000)) {
      if (status->snan_bit_is_one == '\0') {
        return 0x7ff8000000000000;
      }
      return 0x7ff7ffffffffffff;
    }
    uVar2 = (ulong)local_20.sign << 0x3f | local_20.high >> 0xc;
  }
  return uVar2 | 0x7ff0000000000000;
}

Assistant:

float64 float128_to_float64(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloat64(float128ToCommonNaN(a, status), status);
        }
        return packFloat64( aSign, 0x7FF, 0 );
    }
    shortShift128Left( aSig0, aSig1, 14, &aSig0, &aSig1 );
    aSig0 |= ( aSig1 != 0 );
    if ( aExp || aSig0 ) {
        aSig0 |= UINT64_C(0x4000000000000000);
        aExp -= 0x3C01;
    }
    return roundAndPackFloat64(aSign, aExp, aSig0, status);

}